

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate_tz.cpp
# Opt level: O2

int __thiscall
QTzTimeZonePrivate::standardTimeOffset(QTzTimeZonePrivate *this,qint64 atMSecsSinceEpoch)

{
  long in_FS_OFFSET;
  Data DStack_48;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  data(&DStack_48,this,atMSecsSinceEpoch);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&DStack_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return DStack_48.standardTimeOffset;
  }
  __stack_chk_fail();
}

Assistant:

int QTzTimeZonePrivate::standardTimeOffset(qint64 atMSecsSinceEpoch) const
{
    return data(atMSecsSinceEpoch).standardTimeOffset;
}